

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06b.cpp
# Opt level: O3

string * day6b::recover_message(string *__return_storage_ptr__,string *input)

{
  pair<char,_char> *ppVar1;
  pair<char,_char> *ppVar2;
  long lVar3;
  char cVar4;
  pair<char,_char> pVar5;
  ushort uVar6;
  char *pcVar7;
  istream *piVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  pair<char,_char> *ppVar12;
  char *pcVar13;
  char *pcVar14;
  size_type sVar15;
  pair<char,_char> *ppVar16;
  char cVar17;
  pair<char,_char> *ppVar18;
  char cVar19;
  long lVar20;
  long lVar21;
  array<std::pair<char,_char>,_26UL> *letters;
  string line;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  columns;
  istringstream stream;
  allocator_type local_1f1;
  string *local_1f0;
  undefined1 *local_1e8;
  size_type local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  local_1c8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = 0;
  std::operator>>((istream *)local_1b0,(string *)&local_1e8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)local_1e0);
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::vector(&local_1c8,local_1e0,&local_1f1);
  do {
    if (local_1e0 != 0) {
      ppVar12 = (pair<char,_char> *)
                ((long)local_1c8.
                       super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + -0xc2);
      sVar15 = 0;
      do {
        cVar17 = local_1e8[sVar15];
        ppVar12[cVar17].first = cVar17;
        ppVar12[cVar17].second = ppVar12[cVar17].second + '\x01';
        sVar15 = sVar15 + 1;
        ppVar12 = ppVar12 + 0x1a;
      } while (local_1e0 != sVar15);
    }
    piVar8 = std::operator>>((istream *)local_1b0,(string *)&local_1e8);
  } while (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0);
  if (local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar14 = &((pair<char,_char> *)
               ((long)local_1c8.
                      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x20))->second;
    lVar21 = 0;
    ppVar12 = (local_1c8.
               super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    local_1f0 = __return_storage_ptr__;
    do {
      ppVar1 = ppVar12 + 0x1a;
      std::
      __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day6b::recover_message(std::__cxx11::string_const&)::__0>>
                (ppVar12,ppVar1,8);
      lVar9 = 2;
      lVar10 = 2;
      ppVar16 = ppVar12;
      do {
        ppVar2 = ppVar16 + 1;
        if ((ppVar16[1].second == '\0') ||
           (ppVar12->second != '\0' && ppVar12->second <= ppVar16[1].second)) {
          pVar5 = *ppVar2;
          cVar17 = pVar5.second;
          ppVar18 = ppVar2;
          if ((0xff < (ushort)pVar5) &&
             (cVar19 = ppVar16->second, ppVar16 = ppVar2, cVar19 == '\0' || cVar17 < cVar19)) {
            do {
              ppVar18 = ppVar16 + -1;
              cVar4 = ppVar16[-2].second;
              ppVar16->first = ppVar16[-1].first;
              ppVar16->second = cVar19;
              ppVar16 = ppVar18;
              cVar19 = cVar4;
            } while (cVar17 < cVar4 || cVar4 == '\0');
          }
          ppVar18->first = pVar5.first;
          ppVar18->second = cVar17;
        }
        else {
          pVar5 = *ppVar2;
          lVar20 = 0;
          do {
            ppVar16[lVar20 + 1] = ppVar16[lVar20];
            lVar3 = lVar9 + lVar20;
            lVar20 = lVar20 + -1;
          } while (1 < lVar3 - 1U);
          ppVar12->first = pVar5.first;
          ppVar12->second = pVar5.second;
        }
        lVar10 = lVar10 + 2;
        lVar9 = lVar9 + 1;
        ppVar16 = ppVar2;
      } while (lVar10 != 0x20);
      lVar9 = 0x20;
      pcVar11 = pcVar14;
      do {
        pcVar13 = &ppVar12->first + lVar9;
        uVar6 = *(ushort *)(&ppVar12->first + lVar9);
        cVar17 = (char)(uVar6 >> 8);
        if ((0xff < uVar6) &&
           (cVar19 = pcVar13[-1], pcVar7 = pcVar11, cVar19 == '\0' || cVar17 < cVar19)) {
          do {
            do {
              pcVar13 = pcVar7;
              cVar4 = pcVar13[-4];
              ((pair<char,_char> *)(pcVar13 + -1))->first = pcVar13[-3];
              *pcVar13 = cVar19;
              pcVar7 = pcVar13 + -2;
              cVar19 = cVar4;
            } while (cVar4 == '\0');
          } while (cVar17 < cVar4);
          pcVar13 = pcVar13 + -3;
        }
        *pcVar13 = (char)uVar6;
        pcVar13[1] = cVar17;
        lVar9 = lVar9 + 2;
        pcVar11 = pcVar11 + 2;
      } while (lVar9 != 0x34);
      (local_1f0->_M_dataplus)._M_p[lVar21] = ppVar12->first;
      lVar21 = lVar21 + 1;
      pcVar14 = pcVar14 + 0x34;
      __return_storage_ptr__ = local_1f0;
      ppVar12 = ppVar1;
    } while (ppVar1 != (local_1c8.
                        super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems);
  }
  if ((local_1c8.
       super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems != (pair<char,_char> *)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string recover_message(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		stream >> line;
		std::string ret(line.size(), ' ');
		std::vector<std::array<std::pair<char, char>, 26>> columns(line.size());
		do {
			int i = 0;
			for(auto c : line) {
				auto& l = columns[i++][c - 'a'];
				l.first = c;
				l.second++;
			}
		} while(stream >> line);

		int i = 0;
		for(auto& letters : columns) {
			std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
				if(a.second == 0) return false;
				if(b.second == 0) return true;
				return a.second < b.second;
			});
			ret[i++] = letters[0].first;
		}
		return ret;
	}